

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

vector<YAML::Node,_std::allocator<YAML::Node>_> *
YAML::LoadAll(vector<YAML::Node,_std::allocator<YAML::Node>_> *__return_storage_ptr__,istream *input
             )

{
  bool bVar1;
  Parser parser;
  NodeBuilder builder;
  Parser PStack_e8;
  Node local_d8;
  NodeBuilder local_98;
  
  (__return_storage_ptr__->super__Vector_base<YAML::Node,_std::allocator<YAML::Node>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<YAML::Node,_std::allocator<YAML::Node>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<YAML::Node,_std::allocator<YAML::Node>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Parser::Parser(&PStack_e8,input);
  while( true ) {
    NodeBuilder::NodeBuilder(&local_98);
    bVar1 = Parser::HandleNextDocument(&PStack_e8,&local_98.super_EventHandler);
    if (!bVar1) break;
    NodeBuilder::Root(&local_d8,&local_98);
    std::vector<YAML::Node,_std::allocator<YAML::Node>_>::emplace_back<YAML::Node>
              (__return_storage_ptr__,&local_d8);
    if (local_d8.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.m_invalidKey._M_dataplus._M_p != &local_d8.m_invalidKey.field_2) {
      operator_delete(local_d8.m_invalidKey._M_dataplus._M_p);
    }
    NodeBuilder::~NodeBuilder(&local_98);
  }
  NodeBuilder::~NodeBuilder(&local_98);
  Parser::~Parser(&PStack_e8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Node> LoadAll(std::istream& input) {
  std::vector<Node> docs;

  Parser parser(input);
  while (true) {
    NodeBuilder builder;
    if (!parser.HandleNextDocument(builder)) {
      break;
    }
    docs.push_back(builder.Root());
  }

  return docs;
}